

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testMissingUpdatableModelParameters(void)

{
  bool bVar1;
  ostream *poVar2;
  Result local_a8;
  undefined1 local_78 [8];
  Result res;
  undefined1 local_40 [8];
  Model m;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax((Model *)local_40);
  CoreML::Model::validate((Result *)local_78,(Model *)local_40);
  bVar1 = CoreML::Result::good((Result *)local_78);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2ea);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((res).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    CoreML::Specification::Model::Clear((Model *)local_40);
    buildBasicUpdatableModelWithMeanSquaredError((Model *)local_40);
    CoreML::Model::validate(&local_a8,(Model *)local_40);
    CoreML::Result::operator=((Result *)local_78,&local_a8);
    CoreML::Result::~Result(&local_a8);
    bVar1 = CoreML::Result::good((Result *)local_78);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2f4);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"!((res).good())");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      m._oneof_case_[0] = 0;
    }
  }
  local_a8.m_message._M_storage._M_storage[4] = '\x01';
  local_a8.m_message._M_storage._M_storage[5] = '\0';
  local_a8.m_message._M_storage._M_storage[6] = '\0';
  local_a8.m_message._M_storage._M_storage[7] = '\0';
  CoreML::Result::~Result((Result *)local_78);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m._oneof_case_[0];
}

Assistant:

int testMissingUpdatableModelParameters() {

    Specification::Model m;

    // basic neural network model with CCE and softmax without any updatable model parameters.
    buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(m);

    // expect validation to fail due to missing updatable model parameters.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);

    // clear model and redo test with MSE
    m.Clear();

    // basic neural network model with MSE without any updatable model parameters.
    buildBasicUpdatableModelWithMeanSquaredError(m);

    // expect validation to fail due to missing updatable model parameters.
    res = Model::validate(m);
    ML_ASSERT_BAD(res);

    return 0;
}